

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalParse
          (GeneratedCodeInfo_Annotation *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *metadata;
  uint64 uVar2;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  undefined4 in_stack_ffffffffffffffa8;
  int32 in_stack_ffffffffffffffac;
  ParseContext *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits in_stack_ffffffffffffffd4;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  metadata = GetArenaNoVirtual((GeneratedCodeInfo_Annotation *)in_stack_ffffffffffffffb0);
  local_20 = in_RSI;
  do {
    bVar1 = internal::ParseContext::Done
                      (in_stack_ffffffffffffffb0,
                       (char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00519b06;
    local_20 = internal::ReadTag((char *)in_RDX,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                          in_stack_ffffffffffffffd0),
                                 (uint32)((ulong)metadata >> 0x20));
    if (local_20 == (char *)0x0) break;
    in_stack_ffffffffffffffb0 = (ParseContext *)(ulong)((in_stack_ffffffffffffffc4 >> 3) - 1);
    switch(in_stack_ffffffffffffffb0) {
    case (ParseContext *)0x0:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 10) {
        _internal_mutable_path((GeneratedCodeInfo_Annotation *)in_RDI);
        local_20 = internal::PackedInt32Parser
                             (in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (ParseContext *)0x519938);
      }
      else {
        if ((in_stack_ffffffffffffffc4 & 0xff) != 8) goto switchD_00519903_default;
        internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        _internal_add_path((GeneratedCodeInfo_Annotation *)in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffac);
      }
      break;
    case (ParseContext *)0x1:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x12) goto switchD_00519903_default;
      _internal_mutable_source_file_abi_cxx11_
                ((GeneratedCodeInfo_Annotation *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)metadata,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI);
      break;
    case (ParseContext *)0x2:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x18) goto switchD_00519903_default;
      _Internal::set_has_begin((HasBits *)&stack0xffffffffffffffd4);
      uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
      *(int *)((in_RDI->super_EpsCopyInputStream).buffer_ + 0x10) = (int)uVar2;
      break;
    case (ParseContext *)0x3:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x20) goto switchD_00519903_default;
      _Internal::set_has_end((HasBits *)&stack0xffffffffffffffd4);
      uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
      *(int *)((in_RDI->super_EpsCopyInputStream).buffer_ + 0x14) = (int)uVar2;
      break;
    default:
switchD_00519903_default:
      if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
        internal::EpsCopyInputStream::SetLastTag(in_RDX,in_stack_ffffffffffffffc4);
        goto LAB_00519b06;
      }
      local_20 = internal::UnknownFieldParse
                           ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                            (InternalMetadataWithArena *)metadata,
                            (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_RDI);
    }
  } while (local_20 != (char *)0x0);
  local_20 = (char *)0x0;
LAB_00519b06:
  internal::HasBits<1UL>::Or
            ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
             (HasBits<1UL> *)&stack0xffffffffffffffd4);
  return local_20;
}

Assistant:

const char* GeneratedCodeInfo_Annotation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_file = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_file(), ptr, ctx, "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 begin = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}